

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::CheckXFB
          (AttributeBindingDivisorTest *this,GLuint count,GLint *expected,GLchar *log_message)

{
  long lVar1;
  long lVar2;
  long lVar3;
  GLchar *__s;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  int *piVar7;
  size_t sVar8;
  long lVar9;
  GLuint extraout_EDX;
  GLuint extraout_EDX_00;
  GLuint i;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  char *__end;
  ulong uVar11;
  bool bVar12;
  string result_str;
  string expected_str;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  long local_1e0;
  AttributeBindingDivisorTest *local_1d8;
  GLchar *local_1d0;
  ulong local_1c8;
  int *local_1c0;
  GLint *local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar6;
  
  local_1d0 = log_message;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  piVar7 = (int *)(**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd41);
  bVar12 = count == 0;
  if (!bVar12) {
    if (*expected == *piVar7) {
      lVar9 = 0;
      do {
        if (count - 1 == (int)lVar9) {
          bVar12 = true;
          goto LAB_00abb92b;
        }
        lVar2 = lVar9 + 1;
        lVar1 = lVar9 + 1;
        lVar3 = lVar9 + 1;
        lVar9 = lVar1;
      } while (expected[lVar2] == piVar7[lVar3]);
      bVar12 = count <= (uint)lVar1;
    }
    local_200 = local_1f0;
    local_1e0 = lVar6;
    local_1d8 = this;
    local_1c0 = piVar7;
    local_1b8 = expected;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"[","");
    local_220 = local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"[","");
    local_1c8 = (ulong)(count - 1);
    uVar11 = 0;
    uVar10 = extraout_RDX;
    do {
      Utilities::itoa_abi_cxx11_
                ((string *)local_1b0,(Utilities *)(ulong)(uint)local_1b8[uVar11],(GLuint)uVar10);
      std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_1b0);
      i = extraout_EDX;
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
        i = extraout_EDX_00;
      }
      Utilities::itoa_abi_cxx11_((string *)local_1b0,(Utilities *)(ulong)(uint)local_1c0[uVar11],i);
      std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1b0);
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      if (uVar11 < local_1c8) {
        std::__cxx11::string::append((char *)&local_200);
      }
      else {
        std::__cxx11::string::append((char *)&local_200);
      }
      std::__cxx11::string::append((char *)&local_220);
      uVar11 = uVar11 + 1;
      uVar10 = extraout_RDX_00;
    } while (count != uVar11);
    local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Result is ",10);
    __s = local_1d0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(char *)local_220,local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", but ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(char *)local_200,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was expected. ",0xf);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar8);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_220 != local_210) {
      operator_delete(local_220,local_210[0] + 1);
    }
    lVar6 = local_1e0;
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
  }
LAB_00abb92b:
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd67);
  return bVar12;
}

Assistant:

bool AttributeBindingDivisorTest::CheckXFB(const glw::GLuint count, const glw::GLint expected[],
										   const glw::GLchar* log_message)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result setup */
	bool is_ok = true;

	/* Result query. */
	glw::GLint* result = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	/* Check result and return. */
	for (glw::GLuint i = 0; i < count; ++i)
	{
		if (expected[i] != result[i])
		{
			std::string expected_str = "[";
			std::string result_str   = "[";

			for (glw::GLuint j = 0; j < count; ++j)
			{
				expected_str.append(Utilities::itoa((glw::GLuint)expected[j]));
				result_str.append(Utilities::itoa((glw::GLuint)result[j]));

				if (j < count - 1)
				{
					expected_str.append(", ");
					result_str.append(", ");
				}
				else
				{
					expected_str.append("]");
					result_str.append("]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result is " << result_str << ", but "
												<< expected_str << " was expected. " << log_message
												<< tcu::TestLog::EndMessage;

			is_ok = false;
			break;
		}
	}

	/* Unmaping GL buffer. */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}